

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3353::ProfileDataTest_StartResetRestart_Test::TestBody
          (ProfileDataTest_StartResetRestart_Test *this)

{
  ProfileData *this_00;
  ProfileDataChecker *this_01;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  string *__return_storage_ptr__;
  __ino_t *p_Var2;
  pointer pcVar3;
  __syscall_slong_t this_02;
  bool bVar4;
  char *in_R9;
  pointer *__ptr;
  char *pcVar5;
  undefined1 local_158 [8];
  stat statbuf;
  Options local_b4;
  Options options;
  Message MStack_a8;
  ProfileDataSlot slots [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_48;
  AssertHelper local_40;
  AssertionResult gtest_ar__1;
  
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  ProfileData::Options::Options(&local_b4);
  local_b4.frequency_ = 1;
  this_00 = &(this->super_ProfileDataTest).collector_;
  p_Var2 = &statbuf.st_ino;
  pcVar3 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  local_158 = (undefined1  [8])p_Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_158,pcVar3,
             pcVar3 + (this->super_ProfileDataTest).checker_.filename_._M_string_length);
  bVar4 = ProfileData::Start(this_00,(char *)local_158,&local_b4);
  MStack_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)bVar4;
  slots[0] = 0;
  if (local_158 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_158,statbuf.st_ino + 1);
  }
  if (MStack_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)(slots + 7));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)&MStack_a8,
               (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x21c,(char *)local_158);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)(slots + 7));
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_158 != (undefined1  [8])p_Var2) {
      operator_delete((void *)local_158,statbuf.st_ino + 1);
    }
    if (slots[7] != 0) {
      (**(code **)(*(long *)slots[7] + 8))();
    }
  }
  this_01 = &(this->super_ProfileDataTest).checker_;
  if (slots[0] != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)slots,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          slots[0]);
  }
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)this_00;
  ProfileData::Reset(this_00);
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_((string *)local_158,this_01)
  ;
  pcVar5 = "";
  testing::internal::CmpHelperNE<char[1],std::__cxx11::string>
            ((internal *)&MStack_a8,"kNoError","checker_.ValidateProfile()",(char (*) [1])"",
             (string *)local_158);
  if (local_158 != (undefined1  [8])p_Var2) {
    operator_delete((void *)local_158,statbuf.st_ino + 1);
  }
  if (MStack_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if (slots[0] != 0) {
      pcVar5 = *(char **)slots[0];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(slots + 7),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x222,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)(slots + 7),(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(slots + 7));
    if (local_158 != (undefined1  [8])0x0) {
      (**(code **)(*(__ino_t *)local_158 + 8))();
    }
  }
  if (slots[0] != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)slots,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          slots[0]);
  }
  local_40.data_._0_4_ = 0;
  pcVar3 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  MStack_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(slots + 1);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&MStack_a8,pcVar3,
             pcVar3 + (this->super_ProfileDataTest).checker_.filename_._M_string_length);
  local_48.data_._0_4_ =
       stat((char *)MStack_a8.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl,(stat *)local_158);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)(slots + 7),"0","stat(checker_.filename().c_str(), &statbuf)",
             (int *)&local_40,(int *)&local_48);
  if (MStack_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )(slots + 1)) {
    operator_delete((void *)MStack_a8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,slots[1] + 1);
  }
  if ((char)slots[7] == '\0') {
    testing::Message::Message(&MStack_a8);
    if (gtest_ar_1._0_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x225,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,&MStack_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (MStack_a8.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(ProfileDataSlot *)
                    MStack_a8.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 8))();
    }
  }
  if (gtest_ar_1._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_1._0_8_);
  }
  slots[7] = (ulong)slots[7]._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&MStack_a8,"0","statbuf.st_size",(int *)(slots + 7),
             (long *)&statbuf.st_rdev);
  if (MStack_a8.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)(slots + 7));
    if (slots[0] == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)slots[0];
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x226,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)(slots + 7));
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (slots[7] != 0) {
      (**(code **)(*(long *)slots[7] + 8))();
    }
  }
  if (slots[0] != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)slots,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          slots[0]);
  }
  MStack_a8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  slots[1] = 0;
  slots[6] = 0;
  slots[3] = 0;
  slots[4] = 0;
  slots[0] = 3;
  slots[2] = 500000;
  slots[5] = 1;
  local_b4.frequency_ = 2;
  puVar1 = &gtest_ar_1.message_;
  pcVar3 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  slots[7] = (ProfileDataSlot)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(slots + 7),pcVar3,
             pcVar3 + (this->super_ProfileDataTest).checker_.filename_._M_string_length);
  this_02 = statbuf.__glibc_reserved[2];
  bVar4 = ProfileData::Start((ProfileData *)statbuf.__glibc_reserved[2],(char *)slots[7],&local_b4);
  local_40.data_._0_4_ = CONCAT31(local_40.data_._1_3_,bVar4);
  gtest_ar__1.success_ = false;
  gtest_ar__1._1_7_ = 0;
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)slots[7] != puVar1) {
    operator_delete((void *)slots[7],
                    (long)gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (local_40.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(slots + 7),(internal *)&local_40,
               (AssertionResult *)"collector_.Start(checker_.filename().c_str(), options)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x22f,(char *)slots[7]);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff50);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)slots[7] != puVar1) {
      operator_delete((void *)slots[7],
                      (long)gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_48.data_._4_4_,(int)local_48.data_) + 8))();
    }
  }
  if (gtest_ar__1._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__1._0_8_);
  }
  ProfileDataTest::ExpectRunningSamples(&this->super_ProfileDataTest,0);
  ProfileData::Stop((ProfileData *)this_02);
  ProfileDataTest::ExpectStopped(&this->super_ProfileDataTest);
  __return_storage_ptr__ = (string *)(slots + 7);
  (anonymous_namespace)::ProfileDataChecker::ValidateProfile_abi_cxx11_
            (__return_storage_ptr__,this_01);
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_40,"kNoError","checker_.ValidateProfile()",(char (*) [1])"",
             __return_storage_ptr__);
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)slots[7] != puVar1) {
    operator_delete((void *)slots[7],
                    (long)gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (local_40.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)(slots + 7));
    if (gtest_ar__1._0_8_ != 0) {
      pcVar5 = *(char **)gtest_ar__1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x233,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)(slots + 7));
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (slots[7] != 0) {
      (**(code **)(*(long *)slots[7] + 8))();
    }
  }
  if (gtest_ar__1._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__1._0_8_);
  }
  (anonymous_namespace)::ProfileDataChecker::CheckWithSkips_abi_cxx11_
            (__return_storage_ptr__,this_01,(ProfileDataSlot *)&MStack_a8,8,(int *)0x0,0);
  pcVar5 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_40,"kNoError",
             "checker_.Check(slots, (sizeof(slots) / sizeof(*(slots))))",(char (*) [1])"",
             __return_storage_ptr__);
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)slots[7] != puVar1) {
    operator_delete((void *)slots[7],
                    (long)gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (local_40.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)(slots + 7));
    if (gtest_ar__1._0_8_ != 0) {
      pcVar5 = *(char **)gtest_ar__1._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/profiledata_unittest.cc"
               ,0x234,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)(slots + 7));
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (slots[7] != 0) {
      (**(code **)(*(long *)slots[7] + 8))();
    }
  }
  if (gtest_ar__1._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__1._0_8_);
  }
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartResetRestart) {
  ExpectStopped();
  ProfileData::Options options;
  options.set_frequency(1);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Reset();
  ExpectStopped();
  // We expect the resulting file to be empty.  This is a minimal test
  // of ValidateProfile.
  EXPECT_NE(kNoError, checker_.ValidateProfile());

  struct stat statbuf;
  EXPECT_EQ(0, stat(checker_.filename().c_str(), &statbuf));
  EXPECT_EQ(0, statbuf.st_size);

  const int frequency = 2;  // Different frequency than used above.
  ProfileDataSlot slots[] = {
    0, 3, 0, 1000000 / frequency, 0,    // binary header
    0, 1, 0                             // binary trailer
  };

  options.set_frequency(frequency);
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(), options));
  ExpectRunningSamples(0);
  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.Check(slots, arraysize(slots)));
}